

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O1

uint64_t aom_sum_squares_2d_i16_sse2(int16_t *src,int stride,int width,int height)

{
  uint64_t uVar1;
  long lVar2;
  int iVar3;
  undefined1 (*pauVar4) [16];
  long lVar5;
  long lVar7;
  __m128d ad;
  undefined1 auVar6 [16];
  __m128d ad_1;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if ((width == 4) && (height == 4)) {
    auVar8._8_8_ = *(undefined8 *)(src + stride);
    auVar8._0_8_ = *(undefined8 *)src;
    auVar12._8_8_ = *(undefined8 *)(src + stride * 3);
    auVar12._0_8_ = *(undefined8 *)(src + stride * 2);
    auVar6 = pmaddwd(auVar8,auVar8);
    auVar8 = pmaddwd(auVar12,auVar12);
    return (long)(auVar8._12_4_ + auVar6._12_4_ + auVar8._8_4_ + auVar6._8_4_ +
                 auVar8._4_4_ + auVar6._4_4_ + auVar8._0_4_ + auVar6._0_4_);
  }
  if ((width == 4) && ((height & 3U) == 0)) {
    uVar1 = aom_sum_squares_2d_i16_4xn_sse2(src,stride,height);
    return uVar1;
  }
  if ((height & 3U) != 0 || (width & 7U) != 0) {
    uVar1 = aom_sum_squares_2d_i16_c(src,stride,width,height);
    return uVar1;
  }
  iVar3 = 0;
  lVar5 = 0;
  lVar7 = 0;
  do {
    lVar2 = 0;
    auVar6 = (undefined1  [16])0x0;
    pauVar4 = (undefined1 (*) [16])src;
    do {
      auVar12 = pmaddwd(*pauVar4,*pauVar4);
      iVar9 = auVar6._4_4_;
      iVar10 = auVar6._8_4_;
      iVar11 = auVar6._12_4_;
      auVar13 = pmaddwd(*(undefined1 (*) [16])(*pauVar4 + (long)stride * 2),
                        *(undefined1 (*) [16])(*pauVar4 + (long)stride * 2));
      auVar14 = pmaddwd(*(undefined1 (*) [16])(*pauVar4 + (long)(stride * 2) * 2),
                        *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 2) * 2));
      auVar8 = pmaddwd(*(undefined1 (*) [16])(*pauVar4 + (long)(stride * 3) * 2),
                       *(undefined1 (*) [16])(*pauVar4 + (long)(stride * 3) * 2));
      auVar6._0_4_ = auVar8._0_4_ + auVar14._0_4_ + auVar13._0_4_ + auVar12._0_4_ + auVar6._0_4_;
      auVar6._4_4_ = auVar8._4_4_ + auVar14._4_4_ + auVar13._4_4_ + auVar12._4_4_ + iVar9;
      auVar6._8_4_ = auVar8._8_4_ + auVar14._8_4_ + auVar13._8_4_ + auVar12._8_4_ + iVar10;
      auVar6._12_4_ = auVar8._12_4_ + auVar14._12_4_ + auVar13._12_4_ + auVar12._12_4_ + iVar11;
      lVar2 = lVar2 + 8;
      pauVar4 = pauVar4 + 1;
    } while (lVar2 < width);
    lVar5 = lVar5 + (ulong)auVar6._4_4_ + SUB168(auVar6 & _DAT_0051ea50,0);
    lVar7 = lVar7 + (auVar6._8_8_ >> 0x20) + SUB168(auVar6 & _DAT_0051ea50,8);
    iVar3 = iVar3 + 4;
    src = (int16_t *)(*(undefined1 (*) [16])src + (long)(stride * 4) * 2);
  } while (iVar3 < height);
  return lVar7 + lVar5;
}

Assistant:

uint64_t aom_sum_squares_2d_i16_sse2(const int16_t *src, int stride, int width,
                                     int height) {
  // 4 elements per row only requires half an XMM register, so this
  // must be a special case, but also note that over 75% of all calls
  // are with size == 4, so it is also the common case.
  if (LIKELY(width == 4 && height == 4)) {
    return aom_sum_squares_2d_i16_4x4_sse2(src, stride);
  } else if (LIKELY(width == 4 && (height & 3) == 0)) {
    return aom_sum_squares_2d_i16_4xn_sse2(src, stride, height);
  } else if (LIKELY((width & 7) == 0 && (height & 3) == 0)) {
    // Generic case
    return aom_sum_squares_2d_i16_nxn_sse2(src, stride, width, height);
  } else {
    return aom_sum_squares_2d_i16_c(src, stride, width, height);
  }
}